

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

chunk_conflict * chunk_find_adjacent(wchar_t place,char *direction)

{
  level_conflict *plVar1;
  int iVar2;
  long lVar3;
  chunk_conflict *pcVar4;
  
  plVar1 = world->levels;
  iVar2 = strcmp(direction,"north");
  if (iVar2 == 0) {
    lVar3 = 0x18;
  }
  else {
    iVar2 = strcmp(direction,"east");
    if (iVar2 == 0) {
      lVar3 = 0x20;
    }
    else {
      iVar2 = strcmp(direction,"south");
      if (iVar2 == 0) {
        lVar3 = 0x28;
      }
      else {
        iVar2 = strcmp(direction,"west");
        if (iVar2 == 0) {
          lVar3 = 0x30;
        }
        else {
          iVar2 = strcmp(direction,"up");
          if (iVar2 == 0) {
            lVar3 = 0x38;
          }
          else {
            iVar2 = strcmp(direction,"down");
            if (iVar2 != 0) {
              return (chunk_conflict *)0x0;
            }
            lVar3 = 0x40;
          }
        }
      }
    }
  }
  pcVar4 = chunk_find_name(*(char **)((long)&plVar1[place].index + lVar3));
  return pcVar4;
}

Assistant:

struct chunk *chunk_find_adjacent(int place, const char *direction)
{
	struct level *lev = &world->levels[place];

	if (streq(direction, "north")) {
		return chunk_find_name(lev->north);
	} else if (streq(direction, "east")) {
		return chunk_find_name(lev->east);
	} else if (streq(direction, "south")) {
		return chunk_find_name(lev->south);
	} else if (streq(direction, "west")) {
		return chunk_find_name(lev->west);
	} else if (streq(direction, "up")) {
		return chunk_find_name(lev->up);
	} else if (streq(direction, "down")) {
		return chunk_find_name(lev->down);
	}

	return NULL;
}